

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow *window)

{
  ImRect IVar1;
  ImGuiContext *pIVar2;
  ImGuiPlatformMonitor *pIVar3;
  float fVar4;
  float local_5c;
  float local_54;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 padding;
  ImGuiPlatformMonitor *monitor;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  ImRect r_screen;
  
  pIVar2 = GImGui;
  ImRect::ImRect((ImRect *)&window_local);
  if (window->ViewportAllowPlatformMonitorExtend < 0) {
    window_local = *(ImGuiWindow **)&(window->Viewport->super_ImGuiViewport).Pos;
    padding = operator+(&(window->Viewport->super_ImGuiViewport).Pos,
                        &(window->Viewport->super_ImGuiViewport).Size);
    r_screen.Min = padding;
  }
  else {
    pIVar3 = ImVector<ImGuiPlatformMonitor>::operator[]
                       (&(pIVar2->PlatformIO).Monitors,window->ViewportAllowPlatformMonitorExtend);
    window_local = *(ImGuiWindow **)&pIVar3->WorkPos;
    r_screen.Min = operator+(&pIVar3->WorkPos,&pIVar3->WorkSize);
  }
  local_48 = (pIVar2->Style).DisplaySafeAreaPadding;
  fVar4 = ImRect::GetWidth((ImRect *)&window_local);
  if (fVar4 <= local_48.x * 2.0) {
    local_54 = 0.0;
  }
  else {
    local_54 = -local_48.x;
  }
  fVar4 = ImRect::GetHeight((ImRect *)&window_local);
  if (fVar4 <= local_48.y * 2.0) {
    local_5c = 0.0;
  }
  else {
    local_5c = -local_48.y;
  }
  ImVec2::ImVec2(&local_50,local_54,local_5c);
  ImRect::Expand((ImRect *)&window_local,&local_50);
  IVar1.Max = r_screen.Min;
  IVar1.Min = (ImVec2)window_local;
  return IVar1;
}

Assistant:

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    ImRect r_screen;
    if (window->ViewportAllowPlatformMonitorExtend >= 0)
    {
        // Extent with be in the frame of reference of the given viewport (so Min is likely to be negative here)
        const ImGuiPlatformMonitor& monitor = g.PlatformIO.Monitors[window->ViewportAllowPlatformMonitorExtend];
        r_screen.Min = monitor.WorkPos;
        r_screen.Max = monitor.WorkPos + monitor.WorkSize;
    }
    else
    {
        // Use the full viewport area (not work area) for popups
        r_screen.Min = window->Viewport->Pos;
        r_screen.Max = window->Viewport->Pos + window->Viewport->Size;
    }
    ImVec2 padding = g.Style.DisplaySafeAreaPadding;
    r_screen.Expand(ImVec2((r_screen.GetWidth() > padding.x * 2) ? -padding.x : 0.0f, (r_screen.GetHeight() > padding.y * 2) ? -padding.y : 0.0f));
    return r_screen;
}